

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

int SHA1_Final(uchar *md,SHA_CTX *c)

{
  uint8_t auVar1 [8];
  undefined1 local_28 [8];
  uint8_t finalcount [8];
  size_t i;
  SHA1_CTX *context_local;
  uint8_t *digest_local;
  
  finalcount[0] = '\0';
  finalcount[1] = '\0';
  finalcount[2] = '\0';
  finalcount[3] = '\0';
  finalcount[4] = '\0';
  finalcount[5] = '\0';
  finalcount[6] = '\0';
  finalcount[7] = '\0';
  for (; (ulong)finalcount < 8; finalcount = (uint8_t  [8])((long)finalcount + 1)) {
    local_28[(long)finalcount] =
         (char)(c->data[(long)(int)(uint)((ulong)finalcount < 4) + -2] >>
               (('\x03' - (finalcount[0] & 3)) * '\b' & 0x1f));
  }
  SHA1_Update(c,anon_var_dwarf_213f4,1);
  while ((c->Nl & 0x1f8) != 0x1c0) {
    SHA1_Update(c,"",1);
  }
  auVar1._0_4_ = SHA1_Update(c,local_28,8);
  auVar1[4] = '\0';
  auVar1[5] = '\0';
  auVar1[6] = '\0';
  auVar1[7] = '\0';
  finalcount[0] = '\0';
  finalcount[1] = '\0';
  finalcount[2] = '\0';
  finalcount[3] = '\0';
  finalcount[4] = '\0';
  finalcount[5] = '\0';
  finalcount[6] = '\0';
  finalcount[7] = '\0';
  while ((ulong)finalcount < 0x14) {
    md[(long)finalcount] =
         (uchar)(*(uint *)((long)c->data + (((ulong)finalcount & 0xfffffffffffffffc) - 0x1c)) >>
                (('\x03' - (finalcount[0] & 3)) * '\b' & 0x1f));
    auVar1 = (uint8_t  [8])((long)finalcount + 1);
    finalcount = auVar1;
  }
  return auVar1._0_4_;
}

Assistant:

void SHA1_Final(uint8_t digest[20], SHA1_CTX *context)
{
  size_t i;
  uint8_t finalcount[8];

  for (i = 0; i < 8; i++) {
    finalcount[i] = (uint8_t) ((context->count[(i >= 4 ? 0 : 1)]
                    >> ((3 - (i & 3)) * 8)) & 255); /* Endian independent */
  }
  SHA1_Update(context, (uint8_t *) "\x80", 1);
  while ((context->count[0] & 504) != 448)
    SHA1_Update(context, (uint8_t *) "\0", 1);
  SHA1_Update(context, finalcount, 8); /* Should cause a SHA1Transform() */
  for (i = 0; i < 20; i++) {
    digest[i] =
      (uint8_t)((context->state[i >> 2] >> ((3 - (i & 3)) * 8)) & 255);
  }
}